

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *str,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,bool compress)

{
  size_type sVar1;
  ulong __pos;
  char local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __pos = 0;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,str->_M_str,0,
                     str->_M_len);
  while (local_54 = (char)delimiterCharacters, sVar1 != 0xffffffffffffffff) {
    if (sVar1 - __pos == 0) {
      if (local_54 == '\0') {
        local_50._M_string_length = 0;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50.field_2._M_local_buf[0] = '\0';
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      local_50._0_16_ =
           CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)this,__pos,sVar1 - __pos);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
    }
    __pos = sVar1 + 1;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,str->_M_str,__pos,
                       str->_M_len);
  }
  if (__pos < *(ulong *)this) {
    local_50._0_16_ =
         CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)this,__pos,
                    0xffffffffffffffff);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_50)
    ;
  }
  else if (local_54 == '\0') {
    local_50._M_string_length = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_string_split(
    const X& str,
    const X& delimiterCharacters,
    bool compress)
{
    std::vector<XO> ret;

    auto pos = str.find_first_of(delimiterCharacters);
    decltype(pos) start = 0;
    while (pos != X::npos) {
        if (pos != start) {
            ret.emplace_back(str.substr(start, pos - start));
        } else if (!compress) {
            ret.push_back(XO());
        }
        start = pos + 1;
        pos = str.find_first_of(delimiterCharacters, start);
    }
    if (start < str.length()) {
        ret.emplace_back(str.substr(start));
    } else if (!compress) {
        ret.push_back(XO());
    }
    return ret;
}